

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::emit_continue_block_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t continue_block,
          bool follow_true_block,bool follow_false_block)

{
  BlockID BVar1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSVar2;
  size_type sVar3;
  SPIRBlock *block;
  runtime_error *this_00;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  BlockID *pBVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  statements;
  undefined1 local_1248 [288];
  undefined1 local_1128 [4344];
  
  block = Variant::get<spirv_cross::SPIRBlock>
                    ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                     continue_block);
  this->current_continue_block = block;
  local_1248._0_8_ = local_1248 + 0x18;
  local_1248._8_8_ = 0;
  local_1248._16_8_ = 8;
  pSVar2 = this->redirect_statement;
  this->redirect_statement =
       (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *)local_1248;
  if (((this->super_Compiler).ir.block_meta.super_VectorView<unsigned_char>.ptr
       [(block->super_IVariant).self.id] & 1) == 0) {
    do {
      emit_block_instructions(this,block);
      BVar1.id = (block->next_block).id;
      if (BVar1.id == 0) {
        BVar1.id = (block->true_block).id;
        if (BVar1.id == 0 || !follow_true_block) {
          BVar1.id = (block->false_block).id;
          if ((BVar1.id == 0) || (!follow_false_block)) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1128._0_8_ = local_1128 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1128,"Invalid continue block detected!","");
            ::std::runtime_error::runtime_error(this_00,(string *)local_1128);
            *(undefined ***)this_00 = &PTR__runtime_error_003fce08;
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          flush_phi(this,(BlockID)continue_block,BVar1);
          pBVar7 = &block->false_block;
        }
        else {
          flush_phi(this,(BlockID)continue_block,BVar1);
          pBVar7 = &block->true_block;
        }
      }
      else {
        flush_phi(this,(BlockID)continue_block,BVar1);
        pBVar7 = &block->next_block;
      }
      block = Variant::get<spirv_cross::SPIRBlock>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         pBVar7->id);
    } while (((this->super_Compiler).ir.block_meta.super_VectorView<unsigned_char>.ptr
              [(block->super_IVariant).self.id] & 1) == 0);
  }
  this->redirect_statement = pSVar2;
  if (local_1248._8_8_ != 0) {
    lVar4 = local_1248._8_8_ << 5;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248._0_8_;
    do {
      sVar3 = pbVar6->_M_string_length;
      if ((sVar3 != 0) && ((pbVar6->_M_dataplus)._M_p[sVar3 - 1] == ';')) {
        ::std::__cxx11::string::erase((ulong)pbVar6,sVar3 - 1);
      }
      pbVar6 = pbVar6 + 1;
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != 0);
  }
  this->current_continue_block = (SPIRBlock *)0x0;
  local_1128._4120_8_ = local_1128 + 0x1030;
  local_1128._16_8_ = 0;
  local_1128._0_8_ = (char *)0x0;
  local_1128._8_8_ = 0;
  local_1128._4128_8_ = 0;
  local_1128._4136_8_ = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
  if (local_1248._8_8_ != 0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_1248._0_8_ + local_1248._8_8_ * 0x20);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1248._0_8_;
    do {
      StringStream<4096UL,_4096UL>::append
                ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar6->_M_dataplus)._M_p,
                 pbVar6->_M_string_length);
      if (pbVar6 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_1248._0_8_ + (local_1248._8_8_ - 1) * 0x20)) {
        StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar5);
  }
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1248);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::emit_continue_block(uint32_t continue_block, bool follow_true_block, bool follow_false_block)
{
	auto *block = &get<SPIRBlock>(continue_block);

	// While emitting the continue block, declare_temporary will check this
	// if we have to emit temporaries.
	current_continue_block = block;

	SmallVector<string> statements;

	// Capture all statements into our list.
	auto *old = redirect_statement;
	redirect_statement = &statements;

	// Stamp out all blocks one after each other.
	while ((ir.block_meta[block->self] & ParsedIR::BLOCK_META_LOOP_HEADER_BIT) == 0)
	{
		// Write out all instructions we have in this block.
		emit_block_instructions(*block);

		// For plain branchless for/while continue blocks.
		if (block->next_block)
		{
			flush_phi(continue_block, block->next_block);
			block = &get<SPIRBlock>(block->next_block);
		}
		// For do while blocks. The last block will be a select block.
		else if (block->true_block && follow_true_block)
		{
			flush_phi(continue_block, block->true_block);
			block = &get<SPIRBlock>(block->true_block);
		}
		else if (block->false_block && follow_false_block)
		{
			flush_phi(continue_block, block->false_block);
			block = &get<SPIRBlock>(block->false_block);
		}
		else
		{
			SPIRV_CROSS_THROW("Invalid continue block detected!");
		}
	}

	// Restore old pointer.
	redirect_statement = old;

	// Somewhat ugly, strip off the last ';' since we use ',' instead.
	// Ideally, we should select this behavior in statement().
	for (auto &s : statements)
	{
		if (!s.empty() && s.back() == ';')
			s.erase(s.size() - 1, 1);
	}

	current_continue_block = nullptr;
	return merge(statements);
}